

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNNRPL.cpp
# Opt level: O0

void __thiscall NaNNRegrPlantLearn::~NaNNRegrPlantLearn(NaNNRegrPlantLearn *this)

{
  NaNNRegrPlantLearn *in_RDI;
  
  ~NaNNRegrPlantLearn(in_RDI);
  operator_delete(in_RDI,0x19c8);
  return;
}

Assistant:

NaNNRegrPlantLearn::~NaNNRegrPlantLearn ()
{
    // Nothing to do
}